

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void __thiscall
glslang::TIntermediate::finalCheck(TIntermediate *this,TInfoSink *infoSink,bool keepUncalled)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  *psVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  undefined1 uVar4;
  undefined7 uVar5;
  bool bVar6;
  const_iterator cVar7;
  TInfoSinkBase *pTVar8;
  pointer pTVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  uint n;
  ulong uVar13;
  long lVar14;
  key_type local_a0;
  _Base_ptr local_78;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  *local_70;
  key_type local_68;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (this->treeRoot == (TIntermNode *)0x0) {
    return;
  }
  if (this->numEntryPoints < 1) {
    if (this->source == EShSourceGlsl) {
      error(this,infoSink,"Missing entry point: Each stage requires one entry point",EShLangCount);
    }
    else {
      warn(this,infoSink,"Entry point not found",EShLangCount);
    }
  }
  checkCallGraphCycles(this,infoSink);
  checkCallGraphBodies(this,infoSink,keepUncalled);
  inOutLocationCheck(this,infoSink);
  if (1 < this->numPushConstants) {
    error(this,infoSink,"Only one push_constant block is allowed per stage",EShLangCount);
  }
  if (this->invocations == -1) {
    this->invocations = 1;
  }
  local_68._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_68._M_dataplus._M_p._0_1_ = SUB81(&local_68.field_2,0);
  uVar4 = local_68._M_dataplus._M_p._0_1_;
  local_68._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_68.field_2 >> 8);
  uVar5 = local_68._M_dataplus._M_p._1_7_;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
             "gl_ClipDistance","");
  psVar1 = &this->ioAccessed;
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          ::find(&psVar1->_M_t,&local_68);
  p_Var2 = &(this->ioAccessed)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar7._M_node != p_Var2) {
    local_a0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_a0,
               "gl_ClipVertex","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&psVar1->_M_t,&local_a0);
    if ((_Rb_tree_header *)cVar7._M_node != p_Var2) {
      error(this,infoSink,
            "Can only use one of gl_ClipDistance or gl_ClipVertex (gl_ClipDistance is preferred)",
            EShLangCount);
    }
  }
  local_68._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_68._M_dataplus._M_p._0_1_ = uVar4;
  local_68._M_dataplus._M_p._1_7_ = uVar5;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
             "gl_CullDistance","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          ::find(&psVar1->_M_t,&local_68);
  if ((_Rb_tree_header *)cVar7._M_node != p_Var2) {
    local_a0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_a0,
               "gl_ClipVertex","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&psVar1->_M_t,&local_a0);
    if ((_Rb_tree_header *)cVar7._M_node != p_Var2) {
      error(this,infoSink,
            "Can only use one of gl_CullDistance or gl_ClipVertex (gl_ClipDistance is preferred)",
            EShLangCount);
    }
  }
  bVar6 = userOutputUsed(this);
  if (bVar6) {
    local_68._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_68._M_dataplus._M_p._0_1_ = uVar4;
    local_68._M_dataplus._M_p._1_7_ = uVar5;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
               "gl_FragColor","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&psVar1->_M_t,&local_68);
    if ((_Rb_tree_header *)cVar7._M_node == p_Var2) {
      local_a0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_a0,"gl_FragData","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&psVar1->_M_t,&local_a0);
      if ((_Rb_tree_header *)cVar7._M_node == p_Var2) goto LAB_003f3fa7;
    }
    error(this,infoSink,"Cannot use gl_FragColor or gl_FragData when using user-defined outputs",
          EShLangCount);
  }
LAB_003f3fa7:
  local_68._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_68._M_dataplus._M_p._0_1_ = uVar4;
  local_68._M_dataplus._M_p._1_7_ = uVar5;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
             "gl_FragColor","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          ::find(&psVar1->_M_t,&local_68);
  local_78 = &p_Var2->_M_header;
  local_70 = psVar1;
  if ((_Rb_tree_header *)cVar7._M_node != p_Var2) {
    local_a0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_a0,
               "gl_FragData","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&psVar1->_M_t,&local_a0);
    if ((_Rb_tree_header *)cVar7._M_node != p_Var2) {
      error(this,infoSink,"Cannot use both gl_FragColor and gl_FragData",EShLangCount);
    }
  }
  pTVar9 = (this->xfbBuffers).
           super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->xfbBuffers).
      super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar9) {
    lVar14 = 0;
    uVar13 = 0;
    do {
      if ((&pTVar9->contains64BitType)[lVar14] == false) {
        if ((&pTVar9->contains32BitType)[lVar14] != false) {
          uVar10 = 0xfffffffc;
          iVar11 = 3;
          goto LAB_003f4096;
        }
        if ((&pTVar9->contains16BitType)[lVar14] == true) {
          uVar10 = 0xfffffffe;
          iVar11 = 1;
          goto LAB_003f4096;
        }
      }
      else {
        uVar10 = 0xfffffff8;
        iVar11 = 7;
LAB_003f4096:
        *(uint *)((long)&pTVar9->implicitStride + lVar14) =
             iVar11 + *(int *)((long)&pTVar9->implicitStride + lVar14) & uVar10;
      }
      uVar10 = *(uint *)((long)&pTVar9->stride + lVar14);
      n = (uint)uVar13;
      if (uVar10 == 0x3fff) {
        pTVar9 = (pointer)((long)&(pTVar9->ranges).
                                  super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar14);
LAB_003f40b2:
        uVar10 = pTVar9->implicitStride;
        pTVar9->stride = uVar10;
      }
      else if (uVar10 < *(uint *)((long)&pTVar9->implicitStride + lVar14)) {
        error(this,infoSink,"xfb_stride is too small to hold all buffer entries:",EShLangCount);
        TInfoSinkBase::append(&infoSink->info,"ERROR: ");
        TInfoSinkBase::append(&infoSink->info,"    xfb_buffer ");
        pTVar8 = TInfoSinkBase::operator<<(&infoSink->info,n);
        TInfoSinkBase::append(pTVar8,", xfb_stride ");
        pTVar8 = TInfoSinkBase::operator<<
                           (pTVar8,*(uint *)((long)&((this->xfbBuffers).
                                                                                                          
                                                  super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->stride
                                            + lVar14));
        TInfoSinkBase::append(pTVar8,", minimum stride needed: ");
        pTVar8 = TInfoSinkBase::operator<<
                           (pTVar8,*(uint *)((long)&((this->xfbBuffers).
                                                                                                          
                                                  super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  implicitStride + lVar14));
        TInfoSinkBase::append(pTVar8,"\n");
        pTVar9 = (this->xfbBuffers).
                 super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar10 = *(uint *)((long)&pTVar9->stride + lVar14);
        pTVar9 = pTVar9 + uVar13;
        if (uVar10 == 0x3fff) goto LAB_003f40b2;
      }
      else {
        pTVar9 = (pointer)((long)&(pTVar9->ranges).
                                  super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar14);
      }
      if ((((pTVar9->contains64BitType == true) &&
           (pcVar12 = 
            "xfb_stride must be multiple of 8 for buffer holding a double or 64-bit integer:",
           (uVar10 & 7) != 0)) ||
          ((pTVar9->contains32BitType == true &&
           (pcVar12 = "xfb_stride must be multiple of 4:", (uVar10 & 3) != 0)))) ||
         ((pTVar9->contains16BitType == true &&
          (pcVar12 = 
           "xfb_stride must be multiple of 2 for buffer holding a half float or 16-bit integer:",
          (uVar10 & 1) != 0)))) {
        error(this,infoSink,pcVar12,EShLangCount);
        TInfoSinkBase::append(&infoSink->info,"ERROR: ");
        TInfoSinkBase::append(&infoSink->info,"    xfb_buffer ");
        pTVar8 = TInfoSinkBase::operator<<(&infoSink->info,n);
        TInfoSinkBase::append(pTVar8,", xfb_stride ");
        pTVar8 = TInfoSinkBase::operator<<
                           (pTVar8,*(uint *)((long)&((this->xfbBuffers).
                                                                                                          
                                                  super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->stride
                                            + lVar14));
        TInfoSinkBase::append(pTVar8,"\n");
      }
      if ((this->resources).isSet == false) {
LAB_003f4824:
        __assert_fail("isSet",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/localintermediate.h"
                      ,0x121,
                      "const T *glslang::MustBeAssigned<TBuiltInResource>::operator->() const [T = TBuiltInResource]"
                     );
      }
      pTVar9 = (this->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start;
      if ((uint)((this->resources).value.maxTransformFeedbackInterleavedComponents << 2) <
          *(uint *)((long)&pTVar9->stride + lVar14)) {
        error(this,infoSink,"xfb_stride is too large:",EShLangCount);
        TInfoSinkBase::append(&infoSink->info,"ERROR: ");
        TInfoSinkBase::append(&infoSink->info,"    xfb_buffer ");
        pTVar8 = TInfoSinkBase::operator<<(&infoSink->info,n);
        TInfoSinkBase::append(pTVar8,", components (1/4 stride) needed are ");
        pTVar8 = TInfoSinkBase::operator<<
                           (pTVar8,*(uint *)((long)&((this->xfbBuffers).
                                                                                                          
                                                  super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->stride
                                            + lVar14) >> 2);
        TInfoSinkBase::append(pTVar8,", gl_MaxTransformFeedbackInterleavedComponents is ");
        if ((this->resources).isSet == false) goto LAB_003f4824;
        pTVar8 = TInfoSinkBase::operator<<
                           (pTVar8,(this->resources).value.maxTransformFeedbackInterleavedComponents
                           );
        TInfoSinkBase::append(pTVar8,"\n");
        pTVar9 = (this->xfbBuffers).
                 super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x28;
    } while (uVar13 < (ulong)(((long)(this->xfbBuffers).
                                     super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9 >> 3)
                             * -0x3333333333333333));
  }
  switch(this->language) {
  case EShLangVertex:
    goto switchD_003f4342_caseD_0;
  case EShLangTessControl:
    if (this->vertices != -1) goto switchD_003f4342_caseD_0;
    pcVar12 = "At least one shader must specify an output layout(vertices=...)";
    break;
  case EShLangTessEvaluation:
    if (this->source == EShSourceGlsl) {
      if (this->inputPrimitive == ElgNone) {
        error(this,infoSink,"At least one shader must specify an input layout primitive",
              EShLangCount);
      }
      if (this->vertexSpacing == EvsNone) {
        this->vertexSpacing = EvsEqual;
      }
      if (this->vertexOrder == EvoNone) {
        this->vertexOrder = EvoCcw;
      }
    }
    goto switchD_003f4342_caseD_0;
  case EShLangGeometry:
    if (this->inputPrimitive == ElgNone) {
      error(this,infoSink,"At least one shader must specify an input layout primitive",EShLangCount)
      ;
    }
    if (this->outputPrimitive == ElgNone) {
      error(this,infoSink,"At least one shader must specify an output layout primitive",EShLangCount
           );
    }
    if (this->vertices != -1) goto switchD_003f4342_caseD_0;
    pcVar12 = "At least one shader must specify a layout(max_vertices = value)";
    break;
  case EShLangFragment:
    if ((this->postDepthCoverage != true) || (this->earlyFragmentTests != false))
    goto switchD_003f4342_caseD_0;
    pcVar12 = "post_depth_coverage requires early_fragment_tests";
    break;
  case EShLangCompute:
    goto switchD_003f4342_caseD_5;
  case EShLangRayGen:
  case EShLangIntersect:
  case EShLangAnyHit:
  case EShLangClosestHit:
  case EShLangMiss:
  case EShLangCallable:
    if (this->numShaderRecordBlocks < 2) goto switchD_003f4342_caseD_0;
    pcVar12 = "Only one shaderRecordNV buffer block is allowed per stage";
    break;
  case EShLangMesh:
    local_68._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_68._M_dataplus._M_p._0_1_ = SUB81(&local_68.field_2,0);
    uVar4 = local_68._M_dataplus._M_p._0_1_;
    local_68._M_dataplus._M_p._1_7_ = (undefined7)((ulong)&local_68.field_2 >> 8);
    uVar5 = local_68._M_dataplus._M_p._1_7_;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
               "gl_Position","");
    psVar1 = local_70;
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&local_70->_M_t,&local_68);
    p_Var3 = local_78;
    if (cVar7._M_node != local_78) {
      local_a0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_a0,"gl_PositionPerViewNV","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&psVar1->_M_t,&local_a0);
      if (cVar7._M_node != p_Var3) {
        error(this,infoSink,"Can only use one of gl_Position or gl_PositionPerViewNV",EShLangCount);
      }
    }
    local_68._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_68._M_dataplus._M_p._0_1_ = uVar4;
    local_68._M_dataplus._M_p._1_7_ = uVar5;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
               "gl_ClipDistance","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&psVar1->_M_t,&local_68);
    if (cVar7._M_node != p_Var3) {
      local_a0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_a0,"gl_ClipDistancePerViewNV","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&psVar1->_M_t,&local_a0);
      if (cVar7._M_node != p_Var3) {
        error(this,infoSink,"Can only use one of gl_ClipDistance or gl_ClipDistancePerViewNV",
              EShLangCount);
      }
    }
    local_68._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_68._M_dataplus._M_p._0_1_ = uVar4;
    local_68._M_dataplus._M_p._1_7_ = uVar5;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
               "gl_CullDistance","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&psVar1->_M_t,&local_68);
    if (cVar7._M_node != p_Var3) {
      local_a0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_a0,"gl_CullDistancePerViewNV","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&psVar1->_M_t,&local_a0);
      if (cVar7._M_node != p_Var3) {
        error(this,infoSink,"Can only use one of gl_CullDistance or gl_CullDistancePerViewNV",
              EShLangCount);
      }
    }
    local_68._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_68._M_dataplus._M_p._0_1_ = uVar4;
    local_68._M_dataplus._M_p._1_7_ = uVar5;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
               "gl_Layer","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&psVar1->_M_t,&local_68);
    if (cVar7._M_node != p_Var3) {
      local_a0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_a0,"gl_LayerPerViewNV","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&psVar1->_M_t,&local_a0);
      if (cVar7._M_node != p_Var3) {
        error(this,infoSink,"Can only use one of gl_Layer or gl_LayerPerViewNV",EShLangCount);
      }
    }
    local_68._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_68._M_dataplus._M_p._0_1_ = uVar4;
    local_68._M_dataplus._M_p._1_7_ = uVar5;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_68,
               "gl_ViewportMask","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::find(&psVar1->_M_t,&local_68);
    if (cVar7._M_node != p_Var3) {
      local_a0._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_a0,"gl_ViewportMaskPerViewNV","");
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::find(&psVar1->_M_t,&local_a0);
      if (cVar7._M_node != p_Var3) {
        error(this,infoSink,"Can only use one of gl_ViewportMask or gl_ViewportMaskPerViewNV",
              EShLangCount);
      }
    }
    if (this->outputPrimitive == ElgNone) {
      error(this,infoSink,"At least one shader must specify an output layout primitive",EShLangCount
           );
    }
    if (this->vertices == -1) {
      error(this,infoSink,"At least one shader must specify a layout(max_vertices = value)",
            EShLangCount);
    }
    if (this->primitives == -1) {
      error(this,infoSink,"At least one shader must specify a layout(max_primitives = value)",
            EShLangCount);
    }
  case EShLangTask:
    if (1 < this->numTaskNVBlocks) {
      error(this,infoSink,"Only one taskNV interface block is allowed per shader",EShLangCount);
    }
    if (1 < this->numTaskEXTPayloads) {
      error(this,infoSink,"Only single variable of type taskPayloadSharedEXT is allowed per shader",
            EShLangCount);
    }
    goto switchD_003f4342_caseD_5;
  default:
    pcVar12 = "Unknown Stage.";
  }
  error(this,infoSink,pcVar12,EShLangCount);
switchD_003f4342_caseD_0:
  local_68._M_dataplus._M_p._0_1_ = 1;
  local_68._M_dataplus._M_p._1_7_ = 0;
  local_68._M_string_length._0_4_ = 0;
  local_68.field_2._M_allocated_capacity = (size_type)GetThreadPoolAllocator();
  local_68.field_2._8_8_ = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_68._M_dataplus.super_allocator_type.allocator =
       (TPoolAllocator *)&PTR__TIntermTraverser_00af6a50;
  (*this->treeRoot->_vptr_TIntermNode[2])(this->treeRoot,&local_68);
  return;
switchD_003f4342_caseD_5:
  sharedBlockCheck(this,infoSink);
  goto switchD_003f4342_caseD_0;
}

Assistant:

void TIntermediate::finalCheck(TInfoSink& infoSink, bool keepUncalled)
{
    if (getTreeRoot() == nullptr)
        return;

    if (numEntryPoints < 1) {
        if (getSource() == EShSourceGlsl)
            error(infoSink, "Missing entry point: Each stage requires one entry point");
        else
            warn(infoSink, "Entry point not found");
    }

    // recursion and missing body checking
    checkCallGraphCycles(infoSink);
    checkCallGraphBodies(infoSink, keepUncalled);

    // overlap/alias/missing I/O, etc.
    inOutLocationCheck(infoSink);

    if (getNumPushConstants() > 1)
        error(infoSink, "Only one push_constant block is allowed per stage");

    // invocations
    if (invocations == TQualifier::layoutNotSet)
        invocations = 1;

    if (inIoAccessed("gl_ClipDistance") && inIoAccessed("gl_ClipVertex"))
        error(infoSink, "Can only use one of gl_ClipDistance or gl_ClipVertex (gl_ClipDistance is preferred)");
    if (inIoAccessed("gl_CullDistance") && inIoAccessed("gl_ClipVertex"))
        error(infoSink, "Can only use one of gl_CullDistance or gl_ClipVertex (gl_ClipDistance is preferred)");

    if (userOutputUsed() && (inIoAccessed("gl_FragColor") || inIoAccessed("gl_FragData")))
        error(infoSink, "Cannot use gl_FragColor or gl_FragData when using user-defined outputs");
    if (inIoAccessed("gl_FragColor") && inIoAccessed("gl_FragData"))
        error(infoSink, "Cannot use both gl_FragColor and gl_FragData");

    for (size_t b = 0; b < xfbBuffers.size(); ++b) {
        if (xfbBuffers[b].contains64BitType)
            RoundToPow2(xfbBuffers[b].implicitStride, 8);
        else if (xfbBuffers[b].contains32BitType)
            RoundToPow2(xfbBuffers[b].implicitStride, 4);
        else if (xfbBuffers[b].contains16BitType)
            RoundToPow2(xfbBuffers[b].implicitStride, 2);

        // "It is a compile-time or link-time error to have
        // any xfb_offset that overflows xfb_stride, whether stated on declarations before or after the xfb_stride, or
        // in different compilation units. While xfb_stride can be declared multiple times for the same buffer, it is a
        // compile-time or link-time error to have different values specified for the stride for the same buffer."
        if (xfbBuffers[b].stride != TQualifier::layoutXfbStrideEnd && xfbBuffers[b].implicitStride > xfbBuffers[b].stride) {
            error(infoSink, "xfb_stride is too small to hold all buffer entries:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << ", minimum stride needed: " << xfbBuffers[b].implicitStride << "\n";
        }
        if (xfbBuffers[b].stride == TQualifier::layoutXfbStrideEnd)
            xfbBuffers[b].stride = xfbBuffers[b].implicitStride;

        // "If the buffer is capturing any
        // outputs with double-precision or 64-bit integer components, the stride must be a multiple of 8, otherwise it must be a
        // multiple of 4, or a compile-time or link-time error results."
        if (xfbBuffers[b].contains64BitType && ! IsMultipleOfPow2(xfbBuffers[b].stride, 8)) {
            error(infoSink, "xfb_stride must be multiple of 8 for buffer holding a double or 64-bit integer:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << "\n";
        } else if (xfbBuffers[b].contains32BitType && ! IsMultipleOfPow2(xfbBuffers[b].stride, 4)) {
            error(infoSink, "xfb_stride must be multiple of 4:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << "\n";
        }
        // "If the buffer is capturing any
        // outputs with half-precision or 16-bit integer components, the stride must be a multiple of 2"
        else if (xfbBuffers[b].contains16BitType && ! IsMultipleOfPow2(xfbBuffers[b].stride, 2)) {
            error(infoSink, "xfb_stride must be multiple of 2 for buffer holding a half float or 16-bit integer:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", xfb_stride " << xfbBuffers[b].stride << "\n";
        }

        // "The resulting stride (implicit or explicit), when divided by 4, must be less than or equal to the
        // implementation-dependent constant gl_MaxTransformFeedbackInterleavedComponents."
        if (xfbBuffers[b].stride > (unsigned int)(4 * resources->maxTransformFeedbackInterleavedComponents)) {
            error(infoSink, "xfb_stride is too large:");
            infoSink.info.prefix(EPrefixError);
            infoSink.info << "    xfb_buffer " << (unsigned int)b << ", components (1/4 stride) needed are " << xfbBuffers[b].stride/4 << ", gl_MaxTransformFeedbackInterleavedComponents is " << resources->maxTransformFeedbackInterleavedComponents << "\n";
        }
    }

    switch (language) {
    case EShLangVertex:
        break;
    case EShLangTessControl:
        if (vertices == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify an output layout(vertices=...)");
        break;
    case EShLangTessEvaluation:
        if (getSource() == EShSourceGlsl) {
            if (inputPrimitive == ElgNone)
                error(infoSink, "At least one shader must specify an input layout primitive");
            if (vertexSpacing == EvsNone)
                vertexSpacing = EvsEqual;
            if (vertexOrder == EvoNone)
                vertexOrder = EvoCcw;
        }
        break;
    case EShLangGeometry:
        if (inputPrimitive == ElgNone)
            error(infoSink, "At least one shader must specify an input layout primitive");
        if (outputPrimitive == ElgNone)
            error(infoSink, "At least one shader must specify an output layout primitive");
        if (vertices == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify a layout(max_vertices = value)");
        break;
    case EShLangFragment:
        // for GL_ARB_post_depth_coverage, EarlyFragmentTest is set automatically in
        // ParseHelper.cpp. So if we reach here, this must be GL_EXT_post_depth_coverage
        // requiring explicit early_fragment_tests
        if (getPostDepthCoverage() && !getEarlyFragmentTests())
            error(infoSink, "post_depth_coverage requires early_fragment_tests");
        break;
    case EShLangCompute:
        sharedBlockCheck(infoSink);
        break;
    case EShLangRayGen:
    case EShLangIntersect:
    case EShLangAnyHit:
    case EShLangClosestHit:
    case EShLangMiss:
    case EShLangCallable:
        if (numShaderRecordBlocks > 1)
            error(infoSink, "Only one shaderRecordNV buffer block is allowed per stage");
        break;
    case EShLangMesh:
        // NV_mesh_shader doesn't allow use of both single-view and per-view builtins.
        if (inIoAccessed("gl_Position") && inIoAccessed("gl_PositionPerViewNV"))
            error(infoSink, "Can only use one of gl_Position or gl_PositionPerViewNV");
        if (inIoAccessed("gl_ClipDistance") && inIoAccessed("gl_ClipDistancePerViewNV"))
            error(infoSink, "Can only use one of gl_ClipDistance or gl_ClipDistancePerViewNV");
        if (inIoAccessed("gl_CullDistance") && inIoAccessed("gl_CullDistancePerViewNV"))
            error(infoSink, "Can only use one of gl_CullDistance or gl_CullDistancePerViewNV");
        if (inIoAccessed("gl_Layer") && inIoAccessed("gl_LayerPerViewNV"))
            error(infoSink, "Can only use one of gl_Layer or gl_LayerPerViewNV");
        if (inIoAccessed("gl_ViewportMask") && inIoAccessed("gl_ViewportMaskPerViewNV"))
            error(infoSink, "Can only use one of gl_ViewportMask or gl_ViewportMaskPerViewNV");
        if (outputPrimitive == ElgNone)
            error(infoSink, "At least one shader must specify an output layout primitive");
        if (vertices == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify a layout(max_vertices = value)");
        if (primitives == TQualifier::layoutNotSet)
            error(infoSink, "At least one shader must specify a layout(max_primitives = value)");
        [[fallthrough]];
    case EShLangTask:
        if (numTaskNVBlocks > 1)
            error(infoSink, "Only one taskNV interface block is allowed per shader");
        if (numTaskEXTPayloads > 1)
            error(infoSink, "Only single variable of type taskPayloadSharedEXT is allowed per shader");
        sharedBlockCheck(infoSink);
        break;
    default:
        error(infoSink, "Unknown Stage.");
        break;
    }

    // Process the tree for any node-specific work.
    class TFinalLinkTraverser : public TIntermTraverser {
    public:
        TFinalLinkTraverser() { }
        virtual ~TFinalLinkTraverser() { }

        virtual void visitSymbol(TIntermSymbol* symbol)
        {
            // Implicitly size arrays.
            // If an unsized array is left as unsized, it effectively
            // becomes run-time sized.
            symbol->getWritableType().adoptImplicitArraySizes(false);
        }
    } finalLinkTraverser;

    treeRoot->traverse(&finalLinkTraverser);
}